

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

void __thiscall crnlib::symbol_codec::arith_stop_encoding(symbol_codec *this)

{
  uint uVar1;
  uchar local_15;
  uint local_14;
  symbol_codec *psStack_10;
  uint orig_base;
  symbol_codec *this_local;
  
  if (this->m_arith_total_bits != 0) {
    local_14 = this->m_arith_base;
    if (this->m_arith_length < 0x2000001) {
      this->m_arith_base = this->m_arith_base + 0x800000;
      this->m_arith_length = 0x8000;
    }
    else {
      this->m_arith_base = this->m_arith_base + 0x1000000;
      this->m_arith_length = 0x800000;
    }
    psStack_10 = this;
    if (this->m_arith_base < local_14) {
      arith_propagate_carry(this);
    }
    arith_renorm_enc_interval(this);
    while (uVar1 = vector<unsigned_char>::size(&this->m_arith_output_buf), uVar1 < 4) {
      local_15 = '\0';
      vector<unsigned_char>::push_back(&this->m_arith_output_buf,&local_15);
      this->m_total_bits_written = this->m_total_bits_written + 8;
    }
  }
  return;
}

Assistant:

void symbol_codec::arith_stop_encoding() {
  if (!m_arith_total_bits)
    return;

  uint orig_base = m_arith_base;

  if (m_arith_length > 2 * cSymbolCodecArithMinLen) {
    m_arith_base += cSymbolCodecArithMinLen;
    m_arith_length = (cSymbolCodecArithMinLen >> 1);
  } else {
    m_arith_base += (cSymbolCodecArithMinLen >> 1);
    m_arith_length = (cSymbolCodecArithMinLen >> 9);
  }

  if (orig_base > m_arith_base)
    arith_propagate_carry();

  arith_renorm_enc_interval();

  while (m_arith_output_buf.size() < 4) {
    m_arith_output_buf.push_back(0);
    m_total_bits_written += 8;
  }
}